

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<float,_1,_1,0,8,1>,_1,_1,false>,Eigen::Block<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>const>const,_1,_1,false>,Eigen::internal::sub_assign_op<float,float>>
               (Block<Eigen::Matrix<float,__1,__1,_0,_8,_1>,__1,__1,_false> *dst,
               Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false>
               *src,sub_assign_op<float,_float> *func)

{
  undefined8 func_00;
  Block<Eigen::Matrix<float,__1,__1,_0,_8,_1>,__1,__1,_false> *dstExpr;
  undefined1 local_a8 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_60 [8];
  SrcEvaluatorType srcEvaluator;
  sub_assign_op<float,_float> *func_local;
  Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false>
  *src_local;
  Block<Eigen::Matrix<float,__1,__1,_0,_8,_1>,__1,__1,_false> *dst_local;
  
  srcEvaluator.
  super_block_evaluator<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false,_false>
  .
  super_unary_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false>,_Eigen::internal::IndexBased,_float>
  ._56_8_ = func;
  evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_-1,_-1,_false>_>
  ::evaluator((evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false>_>
               *)local_60,src);
  resize_if_allowed<Eigen::Block<Eigen::Matrix<float,_1,_1,0,8,1>,_1,_1,false>,Eigen::Block<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>const>const,_1,_1,false>,Eigen::internal::sub_assign_op<float,float>>
            (dst,src,(sub_assign_op<float,_float> *)
                     srcEvaluator.
                     super_block_evaluator<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false,_false>
                     .
                     super_unary_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false>,_Eigen::internal::IndexBased,_float>
                     ._56_8_);
  evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_8,_1>,_-1,_-1,_false>_>::evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,_8,_1>,__1,__1,_false>_> *)
             &kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_block_evaluator<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false,_false>
            .
            super_unary_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false>,_Eigen::internal::IndexBased,_float>
            ._56_8_;
  dstExpr = EigenBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_8,_1>,_-1,_-1,_false>_>::
            const_cast_derived((EigenBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,_8,_1>,__1,__1,_false>_>
                                *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_8,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_-1,_-1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,_8,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
              *)local_a8,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_60,
             (sub_assign_op<float,_float> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_8,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_-1,_-1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,_8,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
         *)local_a8);
  evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_8,_1>,_-1,_-1,_false>_>::~evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,_8,_1>,__1,__1,_false>_> *)
             &kernel.m_dstExpr);
  evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_-1,_-1,_false>_>
  ::~evaluator((evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,__1,__1,_false>_>
                *)local_60);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}